

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::process_char_buff
          (compiler_type *this,deque<char,_std::allocator<char>_> *raw_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  pointer pcVar5;
  reference pcVar6;
  size_type sVar7;
  reference pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  reference pptVar11;
  int in_ECX;
  compile_error *in_RDX;
  undefined8 in_RSI;
  char32_t *ch_1;
  iterator __end3;
  iterator __begin3;
  u32string *__range3;
  u32string sig_1;
  char32_t *ch;
  iterator __end4;
  iterator __begin4;
  u32string *__range4;
  u32string sig;
  iterator it;
  bool escape;
  bool inside_str;
  bool inside_char;
  token_types type;
  u32string tmp;
  u32string buff;
  unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_> cvt;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff788;
  compile_error *in_stack_fffffffffffff790;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff798;
  compile_error *in_stack_fffffffffffff7a0;
  char32_t __c;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffff7a8;
  compiler_type *in_stack_fffffffffffff7b0;
  undefined6 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7ce;
  undefined1 in_stack_fffffffffffff7cf;
  token_id *in_stack_fffffffffffff7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d8;
  token_signal *in_stack_fffffffffffff7e0;
  string *in_stack_fffffffffffff818;
  allocator *paVar12;
  string local_638 [80];
  token_value *local_5e8;
  undefined1 local_5d9;
  string local_5d8 [32];
  void *local_5b8;
  undefined1 local_5a9;
  string local_5a8 [32];
  void *local_588;
  undefined1 local_580 [32];
  string local_560 [32];
  reference local_540;
  char32_t *local_538;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_530;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_528;
  undefined1 local_520 [32];
  string local_500 [39];
  undefined1 local_4d9;
  string local_4d8 [32];
  void *local_4b8;
  string local_4b0 [32];
  token_base *local_490;
  string local_488 [32];
  undefined4 local_468;
  undefined1 local_462;
  allocator local_461;
  string local_460 [38];
  undefined1 local_43a;
  allocator local_439;
  string local_438 [32];
  string local_418 [72];
  token_value *local_3d0;
  undefined1 local_3c1;
  string local_3c0 [32];
  void *local_3a0;
  undefined1 local_391;
  string local_390 [32];
  void *local_370;
  undefined1 local_368 [32];
  string local_348 [32];
  reference local_328;
  char32_t *local_320;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_318;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_310;
  undefined1 local_308 [32];
  string local_2e8 [39];
  undefined1 local_2c1;
  string local_2c0 [32];
  void *local_2a0;
  string local_298 [32];
  token_base *local_278;
  string local_270 [38];
  undefined1 local_24a;
  undefined1 local_248 [32];
  undefined1 local_228 [64];
  string local_1e8 [40];
  token_value *local_1c0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  void *local_170;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_168;
  undefined1 local_159;
  token_value *local_150;
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  char32_t *local_d0;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_c8;
  byte local_bf;
  byte local_be;
  byte local_bd;
  undefined4 local_bc;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_b8;
  undefined1 local_98 [67];
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  compile_error *local_18;
  undefined8 local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::deque<char,_std::allocator<char>_>::empty
                    ((deque<char,_std::allocator<char>_> *)0x21a493);
  if (bVar1) {
    local_55 = 1;
    uVar10 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Received empty character buffer.",&local_41);
    compile_error::compile_error(in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
    local_55 = 0;
    __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::unique_ptr<cs::codecvt::charset,std::default_delete<cs::codecvt::charset>>::
  unique_ptr<std::default_delete<cs::codecvt::charset>,void>
            ((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_> *)
             in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  if (local_1c == 0) {
    std::make_unique<cs::codecvt::ascii>();
    std::unique_ptr<cs::codecvt::charset,std::default_delete<cs::codecvt::charset>>::operator=
              ((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_> *)
               in_stack_fffffffffffff7a0,
               (unique_ptr<cs::codecvt::ascii,_std::default_delete<cs::codecvt::ascii>_> *)
               in_stack_fffffffffffff798);
    std::unique_ptr<cs::codecvt::ascii,_std::default_delete<cs::codecvt::ascii>_>::~unique_ptr
              ((unique_ptr<cs::codecvt::ascii,_std::default_delete<cs::codecvt::ascii>_> *)
               in_stack_fffffffffffff790);
  }
  else if (local_1c == 1) {
    std::make_unique<cs::codecvt::utf8>();
    std::unique_ptr<cs::codecvt::charset,std::default_delete<cs::codecvt::charset>>::operator=
              ((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_> *)
               in_stack_fffffffffffff7a0,
               (unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_> *)
               in_stack_fffffffffffff798);
    std::unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_>::~unique_ptr
              ((unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_> *)
               in_stack_fffffffffffff790);
  }
  else if (local_1c == 2) {
    std::make_unique<cs::codecvt::gbk>();
    std::unique_ptr<cs::codecvt::charset,std::default_delete<cs::codecvt::charset>>::operator=
              ((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_> *)
               in_stack_fffffffffffff7a0,
               (unique_ptr<cs::codecvt::gbk,_std::default_delete<cs::codecvt::gbk>_> *)
               in_stack_fffffffffffff798);
    std::unique_ptr<cs::codecvt::gbk,_std::default_delete<cs::codecvt::gbk>_>::~unique_ptr
              ((unique_ptr<cs::codecvt::gbk,_std::default_delete<cs::codecvt::gbk>_> *)
               in_stack_fffffffffffff790);
  }
  pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
           operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                       *)0x21a68d);
  (*pcVar5->_vptr_charset[2])(local_98,pcVar5,local_10);
  std::__cxx11::u32string::u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff7b0);
  local_bc = 0;
  local_bd = 0;
  local_be = 0;
  local_bf = 0;
  local_c8._M_current =
       (char32_t *)
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       begin(in_stack_fffffffffffff788);
  while( true ) {
    local_d0 = (char32_t *)
               std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::end
                         (in_stack_fffffffffffff798);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)in_stack_fffffffffffff790,
                       (__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                        *)in_stack_fffffffffffff788);
    if (!bVar1) break;
    if ((local_bd & 1) == 0) {
      if ((local_be & 1) == 0) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 ::operator*(&local_c8);
        if (*pcVar6 == L'#') break;
        switch(local_bc) {
        case 0:
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*(&local_c8);
          if (*pcVar6 == L'\"') {
            local_be = 1;
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator++(&local_c8);
          }
          else {
            pcVar6 = __gnu_cxx::
                     __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                     ::operator*(&local_c8);
            if (*pcVar6 == L'\'') {
              local_bd = 1;
              __gnu_cxx::
              __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              ::operator++(&local_c8);
            }
            else {
              pcVar6 = __gnu_cxx::
                       __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                       ::operator*(&local_c8);
              iVar4 = iswspace(*pcVar6);
              if (iVar4 == 0) {
                __gnu_cxx::
                __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                ::operator*(&local_c8);
                bVar1 = issignal(L'\0');
                if (bVar1) {
                  local_bc = 3;
                }
                else {
                  pcVar6 = __gnu_cxx::
                           __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                           ::operator*(&local_c8);
                  iVar4 = iswdigit(*pcVar6);
                  if (iVar4 == 0) {
                    pcVar5 = std::
                             unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                             ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                           *)0x21b126);
                    pcVar6 = __gnu_cxx::
                             __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                             ::operator*(&local_c8);
                    uVar3 = (*pcVar5->_vptr_charset[4])(pcVar5,(ulong)(uint)*pcVar6);
                    if ((uVar3 & 1) == 0) {
                      local_24a = 1;
                      uVar10 = __cxa_allocate_exception(0x28);
                      __c = (char32_t)((ulong)in_stack_fffffffffffff7a0 >> 0x20);
                      pcVar5 = std::
                               unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                               ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                             *)0x21b19b);
                      __gnu_cxx::
                      __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                      ::operator*(&local_c8);
                      std::allocator<char32_t>::allocator((allocator<char32_t> *)0x21b1ce);
                      std::__cxx11::u32string::u32string
                                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                  *)in_stack_fffffffffffff7b0,(size_type)in_stack_fffffffffffff7a8,
                                 __c,(allocator<char32_t> *)in_stack_fffffffffffff798);
                      (*pcVar5->_vptr_charset[3])(local_228,pcVar5,local_248);
                      std::operator+((char *)in_stack_fffffffffffff798,
                                     (any *)in_stack_fffffffffffff790);
                      compile_error::compile_error
                                (in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
                      local_24a = 0;
                      __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
                    }
                    local_bc = 4;
                  }
                  else {
                    local_bc = 7;
                  }
                }
              }
              else {
                __gnu_cxx::
                __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                ::operator++(&local_c8);
              }
            }
          }
          break;
        default:
          break;
        case 3:
          __gnu_cxx::
          __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator*(&local_c8);
          bVar1 = issignal(L'\0');
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator*(&local_c8);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff790,
                       (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator++(&local_c8);
          }
          else {
            local_bc = 0;
            std::__cxx11::u32string::u32string
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff7b0);
            local_310 = &local_b8;
            local_318._M_current =
                 (char32_t *)
                 std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 begin(in_stack_fffffffffffff788);
            local_320 = (char32_t *)
                        std::__cxx11::
                        basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        ::end(in_stack_fffffffffffff798);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                       *)in_stack_fffffffffffff790,
                                      (__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                       *)in_stack_fffffffffffff788), bVar1) {
              local_328 = __gnu_cxx::
                          __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                          ::operator*(&local_318);
              pcVar5 = std::
                       unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                       ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                     *)0x21b7f2);
              std::operator+(in_stack_fffffffffffff7a8,
                             (char32_t)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
              (*pcVar5->_vptr_charset[3])(local_348,pcVar5,local_368);
              bVar1 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                      ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                               *)in_stack_fffffffffffff790,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff788);
              std::__cxx11::string::~string(local_348);
              std::__cxx11::u32string::~u32string
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)in_stack_fffffffffffff790);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                std::__cxx11::
                basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                            *)in_stack_fffffffffffff790,
                           (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
              }
              else {
                pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
                local_391 = 1;
                pcVar5 = std::
                         unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                         ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                       *)0x21b8ce);
                (*pcVar5->_vptr_charset[3])(local_390,pcVar5,local_308);
                mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                         *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
                token_signal::token_signal
                          (in_stack_fffffffffffff7e0,
                           (signal_types)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
                local_391 = 0;
                local_370 = pvVar9;
                std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                           in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
                std::__cxx11::string::~string(local_390);
                std::__cxx11::
                basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                operator=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)in_stack_fffffffffffff790,
                          (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
              }
              __gnu_cxx::
              __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              ::operator++(&local_318);
            }
            bVar1 = std::__cxx11::
                    basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                    empty((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)0x21ba70);
            if (!bVar1) {
              pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
              local_3c1 = 1;
              pcVar5 = std::
                       unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                       ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                     *)0x21bab1);
              (*pcVar5->_vptr_charset[3])(local_3c0,pcVar5,local_308);
              mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
              ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                       *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
              token_signal::token_signal
                        (in_stack_fffffffffffff7e0,
                         (signal_types)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
              local_3c1 = 0;
              local_3a0 = pvVar9;
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
              std::__cxx11::string::~string(local_3c0);
            }
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)0x21bba3);
            std::__cxx11::u32string::~u32string
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff790);
          }
          break;
        case 4:
          pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                   ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                 *)0x21b324);
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*(&local_c8);
          uVar3 = (*pcVar5->_vptr_charset[4])(pcVar5,(ulong)(uint)*pcVar6);
          if ((uVar3 & 1) == 0) {
            local_bc = 0;
            pcVar5 = std::
                     unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                     operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                 *)0x21b3aa);
            (*pcVar5->_vptr_charset[3])(local_270,pcVar5,&local_b8);
            bVar1 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                    ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                             *)in_stack_fffffffffffff790,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff788);
            std::__cxx11::string::~string(local_270);
            if (bVar1) {
              pcVar5 = std::
                       unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                       ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                     *)0x21b41f);
              (*pcVar5->_vptr_charset[3])(local_298,pcVar5,&local_b8);
              mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
              ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                       *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
              local_278 = std::function<cs::token_base_*()>::operator()
                                    ((function<cs::token_base_*()> *)in_stack_fffffffffffff790);
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
              std::__cxx11::string::~string(local_298);
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)0x21b4b3);
            }
            else {
              pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
              local_2c1 = 1;
              pcVar5 = std::
                       unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                       ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                     *)0x21b53d);
              (*pcVar5->_vptr_charset[3])(local_2c0,pcVar5,&local_b8);
              token_id::token_id(in_stack_fffffffffffff7d0,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff7cf,
                                          CONCAT16(in_stack_fffffffffffff7ce,
                                                   in_stack_fffffffffffff7c8)));
              local_2c1 = 0;
              local_2a0 = pvVar9;
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
              std::__cxx11::string::~string(local_2c0);
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)0x21b5bb);
            }
          }
          else {
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator*(&local_c8);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff790,
                       (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator++(&local_c8);
          }
          break;
        case 7:
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*(&local_c8);
          iVar4 = iswdigit(*pcVar6);
          if ((iVar4 == 0) &&
             (pcVar6 = __gnu_cxx::
                       __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                       ::operator*(&local_c8), *pcVar6 != L'.')) {
            local_bc = 0;
            pcVar5 = std::
                     unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                     operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                 *)0x21bc4a);
            (*pcVar5->_vptr_charset[3])(local_418,pcVar5,&local_b8);
            parse_number(in_stack_fffffffffffff818);
            cs_impl::any::any<cs::numeric>
                      ((any *)in_stack_fffffffffffff7a0,(numeric *)in_stack_fffffffffffff798);
            local_3d0 = new_value(in_stack_fffffffffffff7b0,(var *)in_stack_fffffffffffff7a8);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
            cs_impl::any::~any((any *)0x21bce9);
            std::__cxx11::string::~string(local_418);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)0x21bd03);
          }
          else {
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator*(&local_c8);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff790,
                       (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator++(&local_c8);
          }
          break;
        case 8:
          pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                   ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                 *)0x21b622);
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*(&local_c8);
          uVar3 = (*pcVar5->_vptr_charset[4])(pcVar5,(ulong)(uint)*pcVar6);
          if ((uVar3 & 1) == 0) {
            local_bc = 0;
            pcVar5 = std::
                     unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                     operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                 *)0x21b6a8);
            (*pcVar5->_vptr_charset[3])(local_2e8,pcVar5,&local_b8);
            pptVar11 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                                 ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                  in_stack_fffffffffffff7a0);
            std::__cxx11::string::operator=((string *)(*pptVar11 + 3),local_2e8);
            std::__cxx11::string::~string(local_2e8);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)0x21b701);
          }
          else {
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator*(&local_c8);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff790,
                       (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator++(&local_c8);
          }
        }
      }
      else {
        if ((local_bf & 1) == 0) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*(&local_c8);
          if (*pcVar6 == L'\\') {
            local_bf = 1;
          }
          else {
            pcVar6 = __gnu_cxx::
                     __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                     ::operator*(&local_c8);
            if (*pcVar6 == L'\"') {
              local_be = 0;
              pcVar5 = std::
                       unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                       ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                     *)0x21acb9);
              local_168 = __gnu_cxx::
                          __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                          ::operator+((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                       *)in_stack_fffffffffffff798,
                                      (difference_type)in_stack_fffffffffffff790);
              pcVar6 = __gnu_cxx::
                       __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                       ::operator*(&local_168);
              uVar3 = (*pcVar5->_vptr_charset[4])(pcVar5,(ulong)(uint)*pcVar6);
              if ((uVar3 & 1) == 0) {
                pcVar5 = std::
                         unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                         ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                       *)0x21aec5);
                (*pcVar5->_vptr_charset[3])(local_1e8,pcVar5,&local_b8);
                cs_impl::any::any<std::__cxx11::string>
                          ((any *)in_stack_fffffffffffff7a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff798);
                local_1c0 = new_value(in_stack_fffffffffffff7b0,(var *)in_stack_fffffffffffff7a8);
                std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                           in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
                cs_impl::any::~any((any *)0x21af4d);
                std::__cxx11::string::~string(local_1e8);
              }
              else {
                pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
                local_1b2 = 1;
                pcVar5 = std::
                         unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                         ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                       *)0x21ad4d);
                (*pcVar5->_vptr_charset[3])(local_190,pcVar5,&local_b8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1b0,"",&local_1b1);
                token_literal::token_literal
                          ((token_literal *)in_stack_fffffffffffff7b0,
                           (string_conflict *)in_stack_fffffffffffff7a8,
                           (string_conflict *)in_stack_fffffffffffff7a0);
                local_1b2 = 0;
                local_170 = pvVar9;
                std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                           in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
                std::__cxx11::string::~string(local_1b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
                std::__cxx11::string::~string(local_190);
                local_bc = 8;
              }
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)0x21afb2);
            }
            else {
              __gnu_cxx::
              __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              ::operator*(&local_c8);
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
              operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)in_stack_fffffffffffff790,
                         (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
            }
          }
        }
        else {
          __gnu_cxx::
          __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator*(&local_c8);
          mapping<char32_t,_char32_t>::match
                    ((mapping<char32_t,_char32_t> *)in_stack_fffffffffffff7e0,
                     (char32_t *)in_stack_fffffffffffff7d8);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator+=
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)in_stack_fffffffffffff790,
                     (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
          local_bf = 0;
        }
        __gnu_cxx::
        __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
        ::operator++(&local_c8);
      }
    }
    else {
      if ((local_bf & 1) == 0) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 ::operator*(&local_c8);
        if (*pcVar6 == L'\\') {
          local_bf = 1;
        }
        else {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                   ::operator*(&local_c8);
          if (*pcVar6 == L'\'') {
            bVar1 = std::__cxx11::
                    basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                    empty((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)0x21a7e2);
            if (bVar1) {
              local_f2 = 1;
              uVar10 = __cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_f0,"Do not allow empty character.",&local_f1);
              compile_error::compile_error
                        (in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
              local_f2 = 0;
              __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
            }
            sVar7 = std::__cxx11::
                    basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                    size(&local_b8);
            if (1 < sVar7) {
              local_11a = 1;
              uVar10 = __cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_118,"Char must be a single character.",&local_119);
              compile_error::compile_error
                        (in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
              local_11a = 0;
              __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
            }
            pvVar8 = std::__cxx11::
                     basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                     operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                 *)in_stack_fffffffffffff790,(size_type)in_stack_fffffffffffff788);
            if (0x7f < (uint)*pvVar8) {
              local_142 = 1;
              uVar10 = __cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_140,"Do not support unicode character. Please using string instead.",
                         &local_141);
              compile_error::compile_error
                        (in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
              local_142 = 0;
              __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
            }
            pvVar8 = std::__cxx11::
                     basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                     operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                 *)in_stack_fffffffffffff790,(size_type)in_stack_fffffffffffff788);
            local_159 = (undefined1)*pvVar8;
            cs_impl::any::any<char>
                      ((any *)in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798);
            local_150 = new_value(in_stack_fffffffffffff7b0,(var *)in_stack_fffffffffffff7a8);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
            cs_impl::any::~any((any *)0x21ab98);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)0x21aba5);
            local_bd = 0;
          }
          else {
            __gnu_cxx::
            __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
            ::operator*(&local_c8);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
            operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)in_stack_fffffffffffff790,
                       (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
          }
        }
      }
      else {
        __gnu_cxx::
        __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
        ::operator*(&local_c8);
        mapping<char32_t,_char32_t>::match
                  ((mapping<char32_t,_char32_t> *)in_stack_fffffffffffff7e0,
                   (char32_t *)in_stack_fffffffffffff7d8);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)in_stack_fffffffffffff790,
                     (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
        local_bf = 0;
      }
      __gnu_cxx::
      __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
      ::operator++(&local_c8);
    }
  }
  if ((local_bd & 1) != 0) {
    local_43a = 1;
    uVar10 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,"Lack of the \'.",&local_439);
    compile_error::compile_error(in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
    local_43a = 0;
    __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
  }
  if ((local_be & 1) != 0) {
    local_462 = 1;
    uVar10 = __cxa_allocate_exception(0x28);
    paVar12 = &local_461;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"Lack of the \".",paVar12);
    compile_error::compile_error(in_stack_fffffffffffff790,(string *)in_stack_fffffffffffff788);
    local_462 = 0;
    __cxa_throw(uVar10,&compile_error::typeinfo,compile_error::~compile_error);
  }
  bVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)0x21bf54);
  if (bVar1) {
    local_468 = 1;
  }
  else {
    switch(local_bc) {
    case 3:
      std::__cxx11::u32string::u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffff7b0);
      local_528 = &local_b8;
      local_530._M_current =
           (char32_t *)
           std::__cxx11::
           basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::begin
                     (in_stack_fffffffffffff788);
      local_538 = (char32_t *)
                  std::__cxx11::
                  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::end
                            (in_stack_fffffffffffff798);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                 *)in_stack_fffffffffffff790,
                                (__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                 *)in_stack_fffffffffffff788), bVar1) {
        local_540 = __gnu_cxx::
                    __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                    ::operator*(&local_530);
        pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                 operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                             *)0x21c2c6);
        std::operator+(in_stack_fffffffffffff7a8,
                       (char32_t)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
        (*pcVar5->_vptr_charset[3])(local_560,pcVar5,local_580);
        bVar1 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                         *)in_stack_fffffffffffff790,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff788);
        bVar2 = bVar1 ^ 0xff;
        std::__cxx11::string::~string(local_560);
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_fffffffffffff790);
        if ((bVar2 & 1) == 0) {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator+=
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)in_stack_fffffffffffff790,
                     (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
        }
        else {
          pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
          local_5a9 = 1;
          pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                   ::operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                                 *)0x21c38a);
          (*pcVar5->_vptr_charset[3])(local_5a8,pcVar5,local_520);
          mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
          ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                   *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
          token_signal::token_signal
                    (in_stack_fffffffffffff7e0,
                     (signal_types)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
          local_5a9 = 0;
          local_588 = pvVar9;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
          std::__cxx11::string::~string(local_5a8);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::operator=
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)in_stack_fffffffffffff790,
                     (char32_t)((ulong)in_stack_fffffffffffff788 >> 0x20));
        }
        __gnu_cxx::
        __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
        ::operator++(&local_530);
      }
      bVar1 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)0x21c51a);
      if (!bVar1) {
        pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
        local_5d9 = 1;
        pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                 operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                             *)0x21c555);
        (*pcVar5->_vptr_charset[3])(local_5d8,pcVar5,local_520);
        mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
        ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                 *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        token_signal::token_signal
                  (in_stack_fffffffffffff7e0,
                   (signal_types)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
        local_5d9 = 0;
        local_5b8 = pvVar9;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
        std::__cxx11::string::~string(local_5d8);
        in_stack_fffffffffffff7a0 = local_18;
      }
      local_468 = 8;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffff790);
      break;
    case 4:
      pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
               operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                           *)0x21bfad);
      (*pcVar5->_vptr_charset[3])(local_488,pcVar5,&local_b8);
      bVar1 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
              ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                       *)in_stack_fffffffffffff790,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff788);
      std::__cxx11::string::~string(local_488);
      if (bVar1) {
        pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                 operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                             *)0x21c019);
        (*pcVar5->_vptr_charset[3])(local_4b0,pcVar5,&local_b8);
        mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
        ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                 *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        local_490 = std::function<cs::token_base_*()>::operator()
                              ((function<cs::token_base_*()> *)in_stack_fffffffffffff790);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
        std::__cxx11::string::~string(local_4b0);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::clear((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                0x21c09e);
      }
      else {
        pvVar9 = token_base::operator_new((size_t)in_stack_fffffffffffff790);
        local_4d9 = 1;
        pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
                 operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                             *)0x21c122);
        (*pcVar5->_vptr_charset[3])(local_4d8,pcVar5,&local_b8);
        token_id::token_id(in_stack_fffffffffffff7d0,
                           (string *)
                           CONCAT17(in_stack_fffffffffffff7cf,
                                    CONCAT16(in_stack_fffffffffffff7ce,in_stack_fffffffffffff7c8)));
        local_4d9 = 0;
        local_4b8 = pvVar9;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffff790,(value_type *)in_stack_fffffffffffff788);
        std::__cxx11::string::~string(local_4d8);
      }
      break;
    default:
      break;
    case 7:
      pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
               operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                           *)0x21c671);
      (*pcVar5->_vptr_charset[3])(local_638,pcVar5,&local_b8);
      parse_number(in_stack_fffffffffffff818);
      cs_impl::any::any<cs::numeric>
                ((any *)in_stack_fffffffffffff7a0,(numeric *)in_stack_fffffffffffff798);
      local_5e8 = new_value(in_stack_fffffffffffff7b0,(var *)in_stack_fffffffffffff7a8);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_18,
                 (value_type *)local_5e8);
      cs_impl::any::~any((any *)0x21c705);
      std::__cxx11::string::~string(local_638);
      in_stack_fffffffffffff790 = local_18;
      break;
    case 8:
      pcVar5 = std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::
               operator->((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>
                           *)0x21c1ee);
      (*pcVar5->_vptr_charset[3])(local_500,pcVar5,&local_b8);
      pptVar11 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                           ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                            in_stack_fffffffffffff7a0);
      std::__cxx11::string::operator=((string *)(*pptVar11 + 3),local_500);
      std::__cxx11::string::~string(local_500);
    }
    local_468 = 0;
  }
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff790);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff790);
  std::unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_>::~unique_ptr
            ((unique_ptr<cs::codecvt::charset,_std::default_delete<cs::codecvt::charset>_> *)
             in_stack_fffffffffffff7a0);
  return;
}

Assistant:

void compiler_type::process_char_buff(const std::deque<char> &raw_buff, std::deque<token_base *> &tokens,
	                                      charset encoding)
	{
		if (raw_buff.empty())
			throw compile_error("Received empty character buffer.");
		std::unique_ptr<codecvt::charset> cvt = nullptr;
		switch (encoding) {
		case charset::ascii:
			cvt = std::make_unique<codecvt::ascii>();
			break;
		case charset::utf8:
			cvt = std::make_unique<codecvt::utf8>();
			break;
		case charset::gbk:
			cvt = std::make_unique<codecvt::gbk>();
			break;
		}
		std::u32string buff = cvt->local2wide(raw_buff);
		std::u32string tmp;
		token_types type = token_types::null;
		bool inside_char = false;
		bool inside_str = false;
		bool escape = false;
		for (auto it = buff.begin(); it != buff.end();) {
			if (inside_char) {
				if (escape) {
					tmp += escape_map.match(*it);
					escape = false;
				}
				else if (*it == '\\') {
					escape = true;
				}
				else if (*it == '\'') {
					if (tmp.empty())
						throw compile_error("Do not allow empty character.");
					if (tmp.size() > 1)
						throw compile_error("Char must be a single character.");
					if (tmp[0] > CHAR_MAX)
						throw compile_error("Do not support unicode character. Please using string instead.");
					tokens.push_back(new_value((char) tmp[0]));
					tmp.clear();
					inside_char = false;
				}
				else {
					tmp += *it;
				}
				++it;
				continue;
			}
			if (inside_str) {
				if (escape) {
					tmp += escape_map.match(*it);
					escape = false;
				}
				else if (*it == '\\') {
					escape = true;
				}
				else if (*it == '\"') {
					inside_str = false;
					if (cvt->is_identifier(*(it + 1))) {
						tokens.push_back(new token_literal(cvt->wide2local(tmp), ""));
						type = token_types::literal;
					}
					else
						tokens.push_back(new_value(cvt->wide2local(tmp)));
					tmp.clear();
				}
				else {
					tmp += *it;
				}
				++it;
				continue;
			}
			if (*it == '#')
				break;
			switch (type) {
			default:
				break;
			case token_types::null:
				if (*it == '\"') {
					inside_str = true;
					++it;
					continue;
				}
				if (*it == '\'') {
					inside_char = true;
					++it;
					continue;
				}
				if (std::iswspace(*it)) {
					++it;
					continue;
				}
				if (issignal(*it)) {
					type = token_types::signal;
					continue;
				}
				if (std::iswdigit(*it)) {
					type = token_types::value;
					continue;
				}
				if (cvt->is_identifier(*it)) {
					type = token_types::id;
					continue;
				}
				throw compile_error(std::string("Uknown character: " + cvt->wide2local(std::u32string(1, *it))));
				break;
			case token_types::id:
				if (cvt->is_identifier(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				if (reserved_map.exist(cvt->wide2local(tmp))) {
					tokens.push_back(reserved_map.match(cvt->wide2local(tmp))());
					tmp.clear();
					break;
				}
				tokens.push_back(new token_id(cvt->wide2local(tmp)));
				tmp.clear();
				break;
			case token_types::literal:
				if (cvt->is_identifier(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				static_cast<token_literal *>(tokens.back())->m_literal = cvt->wide2local(tmp);
				tmp.clear();
				break;
			case token_types::signal: {
				if (issignal(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				std::u32string sig;
				for (auto &ch: tmp) {
					if (!signal_map.exist(cvt->wide2local(sig + ch))) {
						tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
						sig = ch;
					}
					else
						sig += ch;
				}
				if (!sig.empty())
					tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
				tmp.clear();
				break;
			}
			case token_types::value:
				if (std::iswdigit(*it) || *it == '.') {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				tokens.push_back(new_value(parse_number(cvt->wide2local(tmp))));
				tmp.clear();
				break;
			}
		}
		if (inside_char)
			throw compile_error("Lack of the \'.");
		if (inside_str)
			throw compile_error("Lack of the \".");
		if (tmp.empty())
			return;
		switch (type) {
		default:
			break;
		case token_types::id:
			if (reserved_map.exist(cvt->wide2local(tmp))) {
				tokens.push_back(reserved_map.match(cvt->wide2local(tmp))());
				tmp.clear();
				break;
			}
			tokens.push_back(new token_id(cvt->wide2local(tmp)));
			break;
		case token_types::literal:
			static_cast<token_literal *>(tokens.back())->m_literal = cvt->wide2local(tmp);
			break;
		case token_types::signal: {
			std::u32string sig;
			for (auto &ch: tmp) {
				if (!signal_map.exist(cvt->wide2local(sig + ch))) {
					tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
					sig = ch;
				}
				else
					sig += ch;
			}
			if (!sig.empty())
				tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
			break;
		}
		case token_types::value:
			tokens.push_back(new_value(parse_number(cvt->wide2local(tmp))));
			break;
		}
	}